

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

int tcptran_pipe_init(void *arg,nni_pipe *npipe)

{
  tcptran_pipe *p;
  nni_pipe *npipe_local;
  void *arg_local;
  
  *(nni_pipe **)((long)arg + 8) = npipe;
  nni_mtx_init((nni_mtx *)((long)arg + 0x600));
  nni_aio_init((nni_aio *)((long)arg + 0xa0),tcptran_pipe_send_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x268),tcptran_pipe_recv_cb,arg);
  nni_aio_init((nni_aio *)((long)arg + 0x430),tcptran_pipe_nego_cb,arg);
  nni_aio_list_init((nni_list *)((long)arg + 0x70));
  nni_aio_list_init((nni_list *)((long)arg + 0x88));
  return 0;
}

Assistant:

static int
tcptran_pipe_init(void *arg, nni_pipe *npipe)
{
	tcptran_pipe *p = arg;
	p->npipe        = npipe;
	nni_mtx_init(&p->mtx);
	nni_aio_init(&p->txaio, tcptran_pipe_send_cb, p);
	nni_aio_init(&p->rxaio, tcptran_pipe_recv_cb, p);
	nni_aio_init(&p->negoaio, tcptran_pipe_nego_cb, p);
	nni_aio_list_init(&p->recvq);
	nni_aio_list_init(&p->sendq);

	return (0);
}